

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

curl_hash *
Curl_hash_alloc(int slots,hash_function hfunc,comp_function comparator,curl_hash_dtor dtor)

{
  int iVar1;
  curl_hash *local_38;
  curl_hash *h;
  curl_hash_dtor dtor_local;
  comp_function comparator_local;
  hash_function hfunc_local;
  curl_hash *pcStack_10;
  int slots_local;
  
  if ((((slots == 0) || (hfunc == (hash_function)0x0)) || (comparator == (comp_function)0x0)) ||
     (dtor == (curl_hash_dtor)0x0)) {
    pcStack_10 = (curl_hash *)0x0;
  }
  else {
    local_38 = (curl_hash *)(*Curl_cmalloc)(0x30);
    if ((local_38 != (curl_hash *)0x0) &&
       (iVar1 = Curl_hash_init(local_38,slots,hfunc,comparator,dtor), iVar1 != 0)) {
      (*Curl_cfree)(local_38);
      local_38 = (curl_hash *)0x0;
    }
    pcStack_10 = local_38;
  }
  return pcStack_10;
}

Assistant:

struct curl_hash *
Curl_hash_alloc(int slots,
                hash_function hfunc,
                comp_function comparator,
                curl_hash_dtor dtor)
{
  struct curl_hash *h;

  if(!slots || !hfunc || !comparator ||!dtor) {
    return NULL; /* failure */
  }

  h = malloc(sizeof(struct curl_hash));
  if(h) {
    if(Curl_hash_init(h, slots, hfunc, comparator, dtor)) {
      /* failure */
      free(h);
      h = NULL;
    }
  }

  return h;
}